

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinAsciiUpper
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  value_type vVar1;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  allocator<char> *in_RSI;
  allocator_type *in_RDI;
  Value VVar5;
  size_t i;
  UString new_str;
  HeapString *str;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_000001e0;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_000001e8;
  string *in_stack_000001f0;
  LocationRange *in_stack_000001f8;
  Interpreter *in_stack_00000200;
  UString *in_stack_fffffffffffffef8;
  Interpreter *in_stack_ffffffffffffff00;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_ffffffffffffff10;
  ulong uVar6;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *__str;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  ulong local_b0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_a8;
  anon_union_8_3_4e909c26_for_v local_88;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  undefined1 local_39 [33];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_18;
  
  __str = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)local_39;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(char *)__str,in_RSI);
  local_7c = 0x13;
  local_78 = &local_7c;
  local_70 = 1;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x29b48c);
  __l._M_len._0_4_ = in_stack_ffffffffffffff40;
  __l._M_array = (iterator)__str;
  __l._M_len._4_4_ = in_stack_ffffffffffffff44;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_RSI,__l,in_RDI);
  validateBuiltinArgs(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,
                      in_stack_000001e0);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(in_stack_ffffffffffffff10);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x29b4f0);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,0);
  local_88 = pvVar2->v;
  std::__cxx11::u32string::u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),__str);
  local_b0 = 0;
  while( true ) {
    uVar6 = local_b0;
    sVar3 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                      (&local_a8);
    if (sVar3 <= uVar6) break;
    pvVar4 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
             operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
    if (0x60 < (uint)*pvVar4) {
      pvVar4 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
               operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
      if ((uint)*pvVar4 < 0x7b) {
        pvVar4 = std::__cxx11::
                 basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                 operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
        vVar1 = *pvVar4;
        pvVar4 = std::__cxx11::
                 basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                 operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
        *pvVar4 = vVar1 + L'\xffffffe0';
      }
    }
    local_b0 = local_b0 + 1;
  }
  VVar5 = makeString(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  *(ulong *)(in_RDI + 0x40) = CONCAT44(in_stack_ffffffffffffff44,VVar5.t);
  ((anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48))->h = (HeapEntity *)VVar5.v;
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             VVar5.v.h);
  return (AST *)0x0;
}

Assistant:

const AST *builtinAsciiUpper(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "asciiUpper", args, {Value::STRING});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        UString new_str(str->value);
        for (size_t i = 0; i < new_str.size(); ++i) {
            if (new_str[i] >= 'a' && new_str[i] <= 'z') {
                new_str[i] = new_str[i] - 'a' + 'A';
            }
        }
        scratch = makeString(new_str);
        return nullptr;
    }